

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3GenerateIndexKey(Parse *pParse,Index *pIdx,int iCur,int regOut,int doMakeRec)

{
  int p2;
  Vdbe *p;
  Table *pTab_00;
  uint uVar1;
  int p1;
  char *local_58;
  char *zAff;
  int idx;
  int nCol;
  int regBase;
  Table *pTab;
  int j;
  Vdbe *v;
  int doMakeRec_local;
  int regOut_local;
  int iCur_local;
  Index *pIdx_local;
  Parse *pParse_local;
  
  p = pParse->pVdbe;
  pTab_00 = pIdx->pTable;
  uVar1 = (uint)pIdx->nColumn;
  p1 = sqlite3GetTempRange(pParse,uVar1 + 1);
  sqlite3VdbeAddOp2(p,0x41,iCur,p1 + uVar1);
  for (pTab._4_4_ = 0; pTab._4_4_ < (int)uVar1; pTab._4_4_ = pTab._4_4_ + 1) {
    p2 = pIdx->aiColumn[pTab._4_4_];
    if (p2 == pTab_00->iPKey) {
      sqlite3VdbeAddOp2(p,0xf,p1 + uVar1,p1 + pTab._4_4_);
    }
    else {
      sqlite3VdbeAddOp3(p,0x1d,iCur,p2,p1 + pTab._4_4_);
      sqlite3ColumnDefault(p,pTab_00,p2,-1);
    }
  }
  if (doMakeRec != 0) {
    if ((pTab_00->pSelect == (Select *)0x0) && ((pParse->db->dbOptFlags & 0x10) == 0)) {
      local_58 = sqlite3IndexAffinityStr(p,pIdx);
    }
    else {
      local_58 = (char *)0x0;
    }
    sqlite3VdbeAddOp3(p,0x1f,p1,uVar1 + 1,regOut);
    sqlite3VdbeChangeP4(p,-1,local_58,0);
  }
  sqlite3ReleaseTempRange(pParse,p1,uVar1 + 1);
  return p1;
}

Assistant:

SQLITE_PRIVATE int sqlite3GenerateIndexKey(
  Parse *pParse,     /* Parsing context */
  Index *pIdx,       /* The index for which to generate a key */
  int iCur,          /* Cursor number for the pIdx->pTable table */
  int regOut,        /* Write the new index key to this register */
  int doMakeRec      /* Run the OP_MakeRecord instruction if true */
){
  Vdbe *v = pParse->pVdbe;
  int j;
  Table *pTab = pIdx->pTable;
  int regBase;
  int nCol;

  nCol = pIdx->nColumn;
  regBase = sqlite3GetTempRange(pParse, nCol+1);
  sqlite3VdbeAddOp2(v, OP_Rowid, iCur, regBase+nCol);
  for(j=0; j<nCol; j++){
    int idx = pIdx->aiColumn[j];
    if( idx==pTab->iPKey ){
      sqlite3VdbeAddOp2(v, OP_SCopy, regBase+nCol, regBase+j);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, iCur, idx, regBase+j);
      sqlite3ColumnDefault(v, pTab, idx, -1);
    }
  }
  if( doMakeRec ){
    const char *zAff;
    if( pTab->pSelect
     || OptimizationDisabled(pParse->db, SQLITE_IdxRealAsInt)
    ){
      zAff = 0;
    }else{
      zAff = sqlite3IndexAffinityStr(v, pIdx);
    }
    sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase, nCol+1, regOut);
    sqlite3VdbeChangeP4(v, -1, zAff, P4_TRANSIENT);
  }
  sqlite3ReleaseTempRange(pParse, regBase, nCol+1);
  return regBase;
}